

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

anon_class_32_4_5f7794cc * __thiscall
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
          (anon_class_32_4_5f7794cc *__return_storage_ptr__,ExtensionSet *this,
          _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
          begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                end,anon_class_32_4_5f7794cc func)

{
  int number;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  end_local;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  begin_local;
  
  local_20._M_node = (_Base_ptr)this;
  it._M_node = begin._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_20,&it);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    number = ppVar2->first;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    InternalSerializeMessageSetWithCachedSizesToArray::anon_class_32_4_5f7794cc::operator()
              (&func,number,&ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator++(&local_20);
  }
  __return_storage_ptr__->target = func.target;
  __return_storage_ptr__->extendee = func.extendee;
  __return_storage_ptr__->stream = func.stream;
  __return_storage_ptr__->extension_set = func.extension_set;
  return __return_storage_ptr__;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }